

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_test.cpp
# Opt level: O2

void __thiscall
ot::commissioner::SocketTest_UdpSocketHello_Test::TestBody(SocketTest_UdpSocketHello_Test *this)

{
  long *plVar1;
  uint16_t uVar2;
  int iVar3;
  pointer *__ptr;
  eventop *peVar4;
  char *pcVar5;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  AssertHelper local_238;
  AssertHelper local_230;
  AssertionResult gtest_ar_3;
  event_base *eventBase;
  ByteArray kHello;
  _Any_data local_1f8;
  code *local_1e8;
  code *pcStack_1e0;
  _Any_data local_1d8;
  code *local_1c8;
  code *pcStack_1c0;
  ByteArray kWorld;
  UdpSocket clientSocket;
  UdpSocket serverSocket;
  
  serverSocket.super_Socket._vptr_Socket._0_4_ = 0x6c6c6568;
  serverSocket.super_Socket._vptr_Socket._4_1_ = 0x6f;
  __l._M_len = 5;
  __l._M_array = (iterator)&serverSocket;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&kHello,__l,(allocator_type *)&clientSocket);
  serverSocket.super_Socket._vptr_Socket._0_4_ = 0x6c726f77;
  serverSocket.super_Socket._vptr_Socket._4_1_ = 100;
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&serverSocket;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&kWorld,__l_00,(allocator_type *)&clientSocket);
  eventBase = event_base_new();
  clientSocket.super_Socket._vptr_Socket = (_func_int **)0x0;
  testing::internal::CmpHelperNE<event_base*,decltype(nullptr)>
            ((internal *)&serverSocket,"eventBase","nullptr",&eventBase,(void **)&clientSocket);
  if ((char)serverSocket.super_Socket._vptr_Socket == '\0') {
    testing::Message::Message((Message *)&clientSocket);
    if (serverSocket.super_Socket.mEventBase == (event_base *)0x0) {
      peVar4 = (eventop *)(anon_var_dwarf_307b52 + 9);
    }
    else {
      peVar4 = (serverSocket.super_Socket.mEventBase)->evsel;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp"
               ,0xa1,(char *)peVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&clientSocket)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    if (clientSocket.super_Socket._vptr_Socket != (_func_int **)0x0) {
      (**(code **)(*clientSocket.super_Socket._vptr_Socket + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&serverSocket.super_Socket.mEventBase);
  UdpSocket::UdpSocket(&serverSocket,eventBase);
  local_1c8 = (code *)0x0;
  pcStack_1c0 = (code *)0x0;
  local_1d8._M_unused._M_object = (void *)0x0;
  local_1d8._8_8_ = 0;
  local_1d8._M_unused._M_object = operator_new(0x18);
  *(UdpSocket **)local_1d8._M_unused._0_8_ = &serverSocket;
  *(vector<unsigned_char,_std::allocator<unsigned_char>_> **)((long)local_1d8._M_unused._0_8_ + 8) =
       &kHello;
  *(vector<unsigned_char,_std::allocator<unsigned_char>_> **)
   ((long)local_1d8._M_unused._0_8_ + 0x10) = &kWorld;
  pcStack_1c0 = std::
                _Function_handler<void_(short),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp:164:34)>
                ::_M_invoke;
  local_1c8 = std::
              _Function_handler<void_(short),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp:164:34)>
              ::_M_manager;
  UdpSocket::SetEventHandler(&serverSocket,(EventHandler *)&local_1d8);
  std::_Function_base::~_Function_base((_Function_base *)&local_1d8);
  iVar3 = UdpSocket::Bind(&serverSocket,(string *)kServerAddr_abi_cxx11_,kServerPort);
  gtest_ar_3.success_ = SUB41(iVar3,0);
  gtest_ar_3._1_1_ = SUB41((uint)iVar3 >> 8,0);
  gtest_ar_3._2_2_ = SUB42((uint)iVar3 >> 0x10,0);
  local_238.data_ = (AssertHelperData *)((ulong)local_238.data_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&clientSocket,"serverSocket.Bind(kServerAddr, kServerPort)","0",
             (int *)&gtest_ar_3,(int *)&local_238);
  if ((char)clientSocket.super_Socket._vptr_Socket == '\0') {
    testing::Message::Message((Message *)&gtest_ar_3);
    if (clientSocket.super_Socket.mEventBase == (event_base *)0x0) {
      peVar4 = (eventop *)(anon_var_dwarf_307b52 + 9);
    }
    else {
      peVar4 = (clientSocket.super_Socket.mEventBase)->evsel;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp"
               ,0xb4,(char *)peVar4);
    testing::internal::AssertHelper::operator=(&local_238,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    plVar1 = (long *)CONCAT44(gtest_ar_3._4_4_,
                              CONCAT22(gtest_ar_3._2_2_,
                                       CONCAT11(gtest_ar_3._1_1_,gtest_ar_3.success_)));
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&clientSocket.super_Socket.mEventBase);
  uVar2 = UdpSocket::GetLocalPort(&serverSocket);
  gtest_ar_3.success_ = SUB21(uVar2,0);
  gtest_ar_3._1_1_ = SUB21(uVar2 >> 8,0);
  testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
            ((internal *)&clientSocket,"serverSocket.GetLocalPort()","kServerPort",
             (unsigned_short *)&gtest_ar_3,&kServerPort);
  if ((char)clientSocket.super_Socket._vptr_Socket == '\0') {
    testing::Message::Message((Message *)&gtest_ar_3);
    if (clientSocket.super_Socket.mEventBase == (event_base *)0x0) {
      peVar4 = (eventop *)(anon_var_dwarf_307b52 + 9);
    }
    else {
      peVar4 = (clientSocket.super_Socket.mEventBase)->evsel;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp"
               ,0xb5,(char *)peVar4);
    testing::internal::AssertHelper::operator=(&local_238,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    plVar1 = (long *)CONCAT44(gtest_ar_3._4_4_,
                              CONCAT22(gtest_ar_3._2_2_,
                                       CONCAT11(gtest_ar_3._1_1_,gtest_ar_3.success_)));
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&clientSocket.super_Socket.mEventBase);
  UdpSocket::UdpSocket(&clientSocket,eventBase);
  local_1e8 = (code *)0x0;
  pcStack_1e0 = (code *)0x0;
  local_1f8._M_unused._M_object = (void *)0x0;
  local_1f8._8_8_ = 0;
  local_1f8._M_unused._M_object = operator_new(0x18);
  *(UdpSocket **)local_1f8._M_unused._0_8_ = &clientSocket;
  *(vector<unsigned_char,_std::allocator<unsigned_char>_> **)((long)local_1f8._M_unused._0_8_ + 8) =
       &kWorld;
  *(event_base ***)((long)local_1f8._M_unused._0_8_ + 0x10) = &eventBase;
  pcStack_1e0 = std::
                _Function_handler<void_(short),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp:184:34)>
                ::_M_invoke;
  local_1e8 = std::
              _Function_handler<void_(short),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp:184:34)>
              ::_M_manager;
  UdpSocket::SetEventHandler(&clientSocket,(EventHandler *)&local_1f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_1f8);
  iVar3 = UdpSocket::Connect(&clientSocket,(string *)kServerAddr_abi_cxx11_,kServerPort);
  local_238.data_._0_4_ = iVar3;
  local_230.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_3,"clientSocket.Connect(kServerAddr, kServerPort)","0",
             (int *)&local_238,(int *)&local_230);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&local_238);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_3.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar5 = anon_var_dwarf_307b52 + 9;
    }
    else {
      pcVar5 = *(char **)gtest_ar_3.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp"
               ,0xc5,pcVar5);
    testing::internal::AssertHelper::operator=(&local_230,(Message *)&local_238);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    if (local_238.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_238.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_3.message_);
  uVar2 = UdpSocket::GetPeerPort(&clientSocket);
  local_238.data_._0_2_ = uVar2;
  testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
            ((internal *)&gtest_ar_3,"clientSocket.GetPeerPort()","kServerPort",
             (unsigned_short *)&local_238,&kServerPort);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&local_238);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_3.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar5 = anon_var_dwarf_307b52 + 9;
    }
    else {
      pcVar5 = *(char **)gtest_ar_3.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp"
               ,0xc6,pcVar5);
    testing::internal::AssertHelper::operator=(&local_230,(Message *)&local_238);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    if (local_238.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_238.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_3.message_);
  local_230.data_._0_4_ =
       UdpSocket::Send(&clientSocket,
                       kHello.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (long)kHello.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)kHello.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
  local_238.data_ =
       (AssertHelperData *)
       (kHello.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish +
       -(long)kHello.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar_3,"clientSocket.Send(&kHello[0], kHello.size())","kHello.size()",
             (int *)&local_230,(unsigned_long *)&local_238);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&local_238);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_3.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar5 = anon_var_dwarf_307b52 + 9;
    }
    else {
      pcVar5 = *(char **)gtest_ar_3.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp"
               ,199,pcVar5);
    testing::internal::AssertHelper::operator=(&local_230,(Message *)&local_238);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    if (local_238.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_238.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_3.message_);
  iVar3 = event_base_loop(eventBase,4);
  local_238.data_._0_4_ = iVar3;
  local_230.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_3,"event_base_loop(eventBase, 0x04)","0",(int *)&local_238,
             (int *)&local_230);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&local_238);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_3.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar5 = anon_var_dwarf_307b52 + 9;
    }
    else {
      pcVar5 = *(char **)gtest_ar_3.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp"
               ,0xc9,pcVar5);
    testing::internal::AssertHelper::operator=(&local_230,(Message *)&local_238);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    if (local_238.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_238.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_3.message_);
  event_base_free(eventBase);
  UdpSocket::~UdpSocket(&clientSocket);
  UdpSocket::~UdpSocket(&serverSocket);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&kWorld.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&kHello.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

TEST(SocketTest, UdpSocketHello)
{
    const ByteArray kHello{'h', 'e', 'l', 'l', 'o'};
    const ByteArray kWorld{'w', 'o', 'r', 'l', 'd'};

    auto eventBase = event_base_new();
    EXPECT_NE(eventBase, nullptr);

    UdpSocket serverSocket{eventBase};
    serverSocket.SetEventHandler([&](short aFlags) {
        uint8_t buf[1024];
        int     len;

        EXPECT_EQ(serverSocket.GetLocalPort(), kServerPort);

        if (aFlags & EV_READ)
        {
            len = serverSocket.Receive(buf, sizeof(buf));
            EXPECT_GT(len, 0);
            EXPECT_EQ((ByteArray{buf, buf + len}), kHello);

            len = serverSocket.Send(&kWorld[0], kWorld.size());
            EXPECT_EQ(static_cast<size_t>(len), kWorld.size());
        }
    });
    EXPECT_EQ(serverSocket.Bind(kServerAddr, kServerPort), 0);
    EXPECT_EQ(serverSocket.GetLocalPort(), kServerPort);

    UdpSocket clientSocket{eventBase};
    clientSocket.SetEventHandler([&](short aFlags) {
        uint8_t buf[1024];
        int     len;

        if (aFlags & EV_READ)
        {
            len = clientSocket.Receive(buf, sizeof(buf));
            EXPECT_EQ((ByteArray{buf, buf + len}), kWorld);

            event_base_loopbreak(eventBase);
        }
    });

    EXPECT_EQ(clientSocket.Connect(kServerAddr, kServerPort), 0);
    EXPECT_EQ(clientSocket.GetPeerPort(), kServerPort);
    EXPECT_EQ(clientSocket.Send(&kHello[0], kHello.size()), kHello.size());

    EXPECT_EQ(event_base_loop(eventBase, EVLOOP_NO_EXIT_ON_EMPTY), 0);
    event_base_free(eventBase);
}